

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall
ON_DimStyle::SetUnitSystemFromContext
          (ON_DimStyle *this,bool bUseName,LengthUnitSystem source_unit_system,
          LengthUnitSystem destination_unit_system)

{
  ON_UUID id_00;
  uchar uVar1;
  LengthUnitSystem LVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int element_count1;
  ON_NameHash *pOVar7;
  ON_UUID *pOVar8;
  ON_DimStyle *this_00;
  ON_LengthUnitName *pOVar9;
  wchar_t *pwVar10;
  wchar_t *string1;
  LengthUnitSystem local_161;
  LengthUnitSystem context_us;
  wchar_t *s1;
  wchar_t *s;
  int name_length;
  ON_wString unit_name;
  undefined1 local_b0 [3];
  LengthUnitSystem name_us;
  uint i;
  ON_SimpleArray<ON_LengthUnitName> name_list;
  size_t name_list_capacity;
  int local_88;
  int dim_style_name_length;
  undefined1 local_78 [8];
  ON_wString dim_style_name;
  ON_DimStyle *from_id;
  ON_UUID id;
  ON_DimStyle *from_name;
  ON_NameHash name_hash;
  int pass;
  LengthUnitSystem dim_style_units;
  LengthUnitSystem destination_unit_system_local;
  LengthUnitSystem source_unit_system_local;
  bool bUseName_local;
  ON_DimStyle *this_local;
  
  name_hash.m_parent_id.Data4[5] = destination_unit_system;
  name_hash.m_parent_id.Data4[6] = source_unit_system;
  name_hash.m_parent_id.Data4[7] = bUseName;
  LVar2 = UnitSystem(this);
  name_hash.m_parent_id.Data4[4] = ON::LengthUnitSystemFromUnsigned((uint)LVar2);
  if (((byte)(name_hash.m_parent_id.Data4[4] + Microns) < 2) ||
     (name_hash.m_parent_id.Data4[4] == CustomUnits)) {
    name_hash.m_parent_id.Data4[4] = '\0';
  }
  name_hash.m_parent_id.Data4[0] = '\0';
  name_hash.m_parent_id.Data4[1] = '\0';
  name_hash.m_parent_id.Data4[2] = '\0';
  name_hash.m_parent_id.Data4[3] = '\0';
  do {
    if ((2 < (int)name_hash.m_parent_id.Data4._0_4_) || (name_hash.m_parent_id.Data4[4] != '\0')) {
      if (name_hash.m_parent_id.Data4[4] == '\0') {
        name_hash.m_parent_id.Data4[4] = '\x02';
      }
      uVar1 = name_hash.m_parent_id.Data4[4];
      LVar2 = UnitSystem(this);
      if (uVar1 != LVar2) {
        SetUnitSystem(this,name_hash.m_parent_id.Data4[4]);
      }
      return;
    }
    if ((name_hash.m_parent_id.Data4._0_4_ != 0) || ((name_hash.m_parent_id.Data4[7] & 1) != 0)) {
      if (name_hash.m_parent_id.Data4._0_4_ == 0) {
        pOVar7 = ON_ModelComponent::NameHash(&this->super_ON_ModelComponent);
        memcpy(&from_name,pOVar7,0x28);
        bVar3 = ON_NameHash::IsValidAndNotEmpty((ON_NameHash *)&from_name);
        if (bVar3) {
          id.Data4 = (uchar  [8])SystemDimstyleFromName((ON_NameHash *)&from_name);
          pOVar7 = ON_ModelComponent::NameHash((ON_ModelComponent *)id.Data4);
          bVar3 = ::operator==((ON_NameHash *)&from_name,pOVar7);
          if (bVar3) {
            pOVar7 = ON_ModelComponent::NameHash(&Default.super_ON_ModelComponent);
            bVar3 = ::operator!=((ON_NameHash *)&from_name,pOVar7);
            if (bVar3) {
              name_hash.m_parent_id.Data4[4] = UnitSystem((ON_DimStyle *)id.Data4);
              goto LAB_005dcc20;
            }
          }
        }
        pOVar8 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
        from_id = *(ON_DimStyle **)pOVar8;
        id._0_8_ = *(undefined8 *)pOVar8->Data4;
        bVar3 = ::operator!=(&ON_nil_uuid,(ON_UUID_struct *)&from_id);
        if (bVar3) {
          dim_style_name.m_s = (wchar_t *)from_id;
          id_00.Data4 = (uchar  [8])id._0_8_;
          id_00._0_8_ = from_id;
          this_00 = SystemDimstyleFromId(id_00);
          pOVar8 = ON_ModelComponent::Id(&this_00->super_ON_ModelComponent);
          bVar3 = ::operator==((ON_UUID_struct *)&from_id,pOVar8);
          if (bVar3) {
            pOVar8 = ON_ModelComponent::Id(&Default.super_ON_ModelComponent);
            bVar3 = ::operator!=((ON_UUID_struct *)&from_id,pOVar8);
            if (bVar3) {
              name_hash.m_parent_id.Data4[4] = UnitSystem(this_00);
              goto LAB_005dcc20;
            }
          }
        }
        ON_ModelComponent::Name((ON_ModelComponent *)local_78);
        ON_wString::TrimLeftAndRight((ON_wString *)local_78,(wchar_t *)0x0);
        ON_wString::MakeLowerOrdinal((ON_wString *)local_78);
        bVar3 = ON_wString::IsEmpty((ON_wString *)local_78);
        if ((!bVar3) && (iVar4 = ON_wString::Length((ON_wString *)local_78), 0 < iVar4)) {
          uVar5 = ON_LengthUnitName::GetLengthUnitNameList(0,(ON_LengthUnitName *)0x0);
          name_list._16_8_ = ZEXT48(uVar5);
          if (name_list._16_8_ != 0) {
            ON_SimpleArray<ON_LengthUnitName>::ON_SimpleArray
                      ((ON_SimpleArray<ON_LengthUnitName> *)local_b0,name_list._16_8_);
            ON_SimpleArray<ON_LengthUnitName>::SetCount
                      ((ON_SimpleArray<ON_LengthUnitName> *)local_b0,name_list.m_count);
            uVar5 = ON_SimpleArray<ON_LengthUnitName>::UnsignedCount
                              ((ON_SimpleArray<ON_LengthUnitName> *)local_b0);
            pOVar9 = ON_SimpleArray<ON_LengthUnitName>::Array
                               ((ON_SimpleArray<ON_LengthUnitName> *)local_b0);
            ON_LengthUnitName::GetLengthUnitNameList((ulong)uVar5,pOVar9);
            for (unit_name.m_s._4_4_ = 0; uVar5 = unit_name.m_s._4_4_,
                uVar6 = ON_SimpleArray<ON_LengthUnitName>::UnsignedCount
                                  ((ON_SimpleArray<ON_LengthUnitName> *)local_b0), uVar5 < uVar6;
                unit_name.m_s._4_4_ = unit_name.m_s._4_4_ + 1) {
              pOVar9 = ON_SimpleArray<ON_LengthUnitName>::operator[]
                                 ((ON_SimpleArray<ON_LengthUnitName> *)local_b0,unit_name.m_s._4_4_)
              ;
              unit_name.m_s._3_1_ = ON_LengthUnitName::LengthUnit(pOVar9);
              bVar3 = ON::IsTerrestrialLengthUnit(unit_name.m_s._3_1_);
              if ((bVar3) &&
                 ((bVar3 = ON::IsMetricLengthUnit(unit_name.m_s._3_1_), bVar3 ||
                  (bVar3 = ON::IsUnitedStatesCustomaryLengthUnit(unit_name.m_s._3_1_), bVar3)))) {
                pOVar9 = ON_SimpleArray<ON_LengthUnitName>::operator[]
                                   ((ON_SimpleArray<ON_LengthUnitName> *)local_b0,
                                    unit_name.m_s._4_4_);
                pwVar10 = ON_LengthUnitName::LengthUnitName(pOVar9);
                ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff40,pwVar10);
                ON_wString::TrimLeftAndRight((ON_wString *)&stack0xffffffffffffff40,(wchar_t *)0x0);
                ON_wString::MakeLowerOrdinal((ON_wString *)&stack0xffffffffffffff40);
                bVar3 = ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffff40);
                if (bVar3) {
                  local_88 = 9;
                }
                else {
                  element_count1 = ON_wString::Length((ON_wString *)&stack0xffffffffffffff40);
                  if (element_count1 < 1) {
                    local_88 = 9;
                  }
                  else if (iVar4 < element_count1) {
                    local_88 = 9;
                  }
                  else {
                    s1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_78);
                    pwVar10 = s1 + ((long)iVar4 - (long)element_count1);
                    for (; s1 <= pwVar10; s1 = s1 + 1) {
                      string1 = ON_wString::operator_cast_to_wchar_t_
                                          ((ON_wString *)&stack0xffffffffffffff40);
                      bVar3 = ON_wString::EqualOrdinal
                                        (string1,element_count1,s1,element_count1,false);
                      if (bVar3) {
                        bVar3 = ON::IsUnitedStatesCustomaryLengthUnit(unit_name.m_s._3_1_);
                        if (bVar3) {
                          name_hash.m_parent_id.Data4[4] = '\b';
                        }
                        else {
                          name_hash.m_parent_id.Data4[4] = '\x02';
                        }
                        break;
                      }
                    }
                    if (name_hash.m_parent_id.Data4[4] == '\0') {
                      local_88 = 0;
                    }
                    else {
                      local_88 = 7;
                    }
                  }
                }
                ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff40);
                if ((local_88 != 0) && (local_88 == 7)) break;
              }
            }
            ON_SimpleArray<ON_LengthUnitName>::~ON_SimpleArray
                      ((ON_SimpleArray<ON_LengthUnitName> *)local_b0);
          }
        }
        ON_wString::~ON_wString((ON_wString *)local_78);
      }
      else if (name_hash.m_parent_id.Data4._0_4_ - 1 < 2) {
        if (name_hash.m_parent_id.Data4._0_4_ == 1) {
          local_161 = name_hash.m_parent_id.Data4[6];
        }
        else {
          local_161 = name_hash.m_parent_id.Data4[5];
        }
        bVar3 = ON::IsUnitedStatesPrinterLengthUnit(local_161);
        if (bVar3) {
          name_hash.m_parent_id.Data4[4] = local_161;
        }
        else {
          bVar3 = ON::IsTerrestrialLengthUnit(local_161);
          if (bVar3) {
            bVar3 = ON::IsUnitedStatesCustomaryLengthUnit(local_161);
            if (bVar3) {
              name_hash.m_parent_id.Data4[4] = '\b';
            }
            else {
              bVar3 = ON::IsMetricLengthUnit(local_161);
              if (bVar3) {
                name_hash.m_parent_id.Data4[4] = '\x02';
              }
            }
          }
        }
      }
    }
LAB_005dcc20:
    name_hash.m_parent_id.Data4._0_4_ = name_hash.m_parent_id.Data4._0_4_ + 1;
  } while( true );
}

Assistant:

void ON_DimStyle::SetUnitSystemFromContext(
  bool bUseName,
  ON::LengthUnitSystem source_unit_system,
  ON::LengthUnitSystem destination_unit_system
)
{
  /// NOTE WELL: A dimstyle unit system was added in V6, but has never been fully used.
  /// The idea was this would make it easier to figure out what text height/ arrow size, 
  /// ... actually meant. Especially in situations where model space and page space have
  /// different unit systems, and in more complex cases like text in instance definitions
  /// and inserting annotation from models with mismatched unit systems.
  /// It is used internally to get some scales properly set and use in limited
  /// merging contexts.
  ///   
  /// From a user's perspective, in Rhino 6 and Rhino 7 ON_DimStyle lengths like TextHeight(), ArrowSize(), ... 
  /// are with respect to the context the annotation resides in. For example, if TextHeight() = 3.5,
  /// model units = meters, page units = millimeters, and DimScale() = 1, then
  /// text created in model space will be 3.5 meters high and
  /// text created in page space will be 3.5 millimeters high.
  /// 
  /// Ideally, ON_DimStyle::UnitSystem() would specify the text height units 
  /// and ON_DimStyle::DimScale() could be adjusted as model space extents require.
  /// Text in instance definitions would have a well defined height and references
  /// to those instance definitions would display predictably in both model space and page space.


  ON::LengthUnitSystem dim_style_units = ON::LengthUnitSystemFromUnsigned(static_cast<unsigned int>(UnitSystem()));

  switch (dim_style_units)
  {
    case ON::LengthUnitSystem::None:
    case ON::LengthUnitSystem::CustomUnits:
    case ON::LengthUnitSystem::Unset:
      dim_style_units = ON::LengthUnitSystem::None;
      break;
    default:
      break;
  }
  
  for (int pass = 0; pass < 3; pass++)
  {
    if (ON::LengthUnitSystem::None != dim_style_units)
      break;
    if (0 == pass && false == bUseName)
      continue;
    switch (pass)
    {
    case 0: // search dimstyle name for metric or United States customary unit system names
      {
        const ON_NameHash name_hash = NameHash();
        if (name_hash.IsValidAndNotEmpty())
        {
          const ON_DimStyle& from_name = ON_DimStyle::SystemDimstyleFromName(name_hash);
          if (name_hash == from_name.NameHash() && name_hash != ON_DimStyle::Default.NameHash())
          {
            dim_style_units = from_name.UnitSystem();
            continue;
          }
        }
    
        const ON_UUID id = Id();
        if (ON_nil_uuid != id )
        {
          const ON_DimStyle& from_id = ON_DimStyle::SystemDimstyleFromId(id);
          if (id == from_id.Id() && id != ON_DimStyle::Default.Id() )
          {
            dim_style_units = from_id.UnitSystem();
            continue;
          }
        }

        ON_wString dim_style_name = Name();
        dim_style_name.TrimLeftAndRight();
        dim_style_name.MakeLowerOrdinal();
        if (dim_style_name.IsEmpty())
          break;
        const int dim_style_name_length = dim_style_name.Length();
        if (dim_style_name_length <= 0)
          break;

        const size_t name_list_capacity = ON_LengthUnitName::GetLengthUnitNameList(0, nullptr);
        if (name_list_capacity <= 0)
          break;

        ON_SimpleArray<ON_LengthUnitName> name_list(name_list_capacity);
        name_list.SetCount((int)name_list_capacity);
        ON_LengthUnitName::GetLengthUnitNameList(name_list.UnsignedCount(), name_list.Array());
        
        for (unsigned int i = 0; i < name_list.UnsignedCount(); i++)
        {
          ON::LengthUnitSystem name_us = name_list[i].LengthUnit();
          if (false == ON::IsTerrestrialLengthUnit(name_us))
            continue;
          if (
            false == ON::IsMetricLengthUnit(name_us)
            && false == ON::IsUnitedStatesCustomaryLengthUnit(name_us) 
            )
            continue;
          ON_wString unit_name = name_list[i].LengthUnitName();
          unit_name.TrimLeftAndRight();
          unit_name.MakeLowerOrdinal();
          if (unit_name.IsEmpty())
            continue;
          const int name_length = unit_name.Length();
          if (name_length <= 0)
            continue;
          if (name_length > dim_style_name_length )
            continue;

          const wchar_t* s = static_cast<const wchar_t*>(dim_style_name);
          const wchar_t* s1 = s + dim_style_name_length - name_length;
          for (/*empty init*/; s <= s1; s++)
          {
            if (ON_wString::EqualOrdinal(static_cast<const wchar_t*>(unit_name), name_length, s, name_length, false))
            {
              if (ON::IsUnitedStatesCustomaryLengthUnit(name_us))
                dim_style_units = ON::LengthUnitSystem::Inches;
              else
                dim_style_units = ON::LengthUnitSystem::Millimeters;
              break;
            }
          }
          if (ON::LengthUnitSystem::None != dim_style_units)
            break;
        }
      }
      break;

    case 1:
    case 2:
      {
        const ON::LengthUnitSystem context_us
          = (1 == pass)
          ? source_unit_system
          : destination_unit_system;
        if (ON::IsUnitedStatesPrinterLengthUnit(context_us))
          dim_style_units = context_us;
        else if (ON::IsTerrestrialLengthUnit(context_us))
        {
          if (ON::IsUnitedStatesCustomaryLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Inches;
          else if (ON::IsMetricLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Millimeters;
        }
      }
      break;
    }
  }

  if (ON::LengthUnitSystem::None == dim_style_units)
    dim_style_units = ON::LengthUnitSystem::Millimeters;

  if( dim_style_units != UnitSystem() )
    SetUnitSystem(dim_style_units);

  return;
}